

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

void capnp::_::expectPrimitiveEq<capnp::Text::Reader>(Reader a,Reader b)

{
  int iVar1;
  Reader b_local;
  Reader a_local;
  DebugComparison<capnp::Text::Reader_&,_capnp::Text::Reader_&> _kjCondition;
  
  a_local.super_StringPtr.content.size_ = a.super_StringPtr.content.size_;
  a_local.super_StringPtr.content.ptr = a.super_StringPtr.content.ptr;
  b_local.super_StringPtr.content.size_ = b.super_StringPtr.content.size_;
  b_local.super_StringPtr.content.ptr = b.super_StringPtr.content.ptr;
  if (a_local.super_StringPtr.content.size_ == b_local.super_StringPtr.content.size_) {
    if (a_local.super_StringPtr.content.size_ == 0) {
      return;
    }
    iVar1 = bcmp(a_local.super_StringPtr.content.ptr,b_local.super_StringPtr.content.ptr,
                 a_local.super_StringPtr.content.size_);
    _kjCondition.result = iVar1 == 0;
    if (_kjCondition.result) {
      return;
    }
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
  }
  else {
    _kjCondition.result = false;
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
  }
  _kjCondition.right = &b_local;
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.left = &a_local;
  kj::_::Debug::
  log<char_const(&)[28],kj::_::DebugComparison<capnp::Text::Reader&,capnp::Text::Reader&>&,capnp::Text::Reader&,capnp::Text::Reader&>
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x9c,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
             (char (*) [28])"failed: expected (a) == (b)",&_kjCondition,_kjCondition.left,&b_local);
  return;
}

Assistant:

void expectPrimitiveEq(T a, T b) { EXPECT_EQ(a, b); }